

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_p_rob3.cpp
# Opt level: O0

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  IkReal x47;
  IkReal x46;
  IkReal x45;
  IkReal x44;
  IkReal x43;
  IkReal x42;
  IkReal x41;
  IkReal x40;
  IkReal x39;
  IkReal x38;
  IkReal x37;
  IkReal x36;
  IkReal x35;
  IkReal x34;
  IkReal x33;
  IkReal x32;
  IkReal x31;
  IkReal x30;
  IkReal x29;
  IkReal x28;
  IkReal x27;
  IkReal x26;
  IkReal x25;
  IkReal x24;
  IkReal x23;
  IkReal x22;
  IkReal x21;
  IkReal x20;
  IkReal x19;
  IkReal x18;
  IkReal x17;
  IkReal x16;
  IkReal x15;
  IkReal x14;
  IkReal x13;
  IkReal x12;
  IkReal x11;
  IkReal x10;
  IkReal x9;
  IkReal x8;
  IkReal x7;
  IkReal x6;
  IkReal x5;
  IkReal x4;
  IkReal x3;
  IkReal x2;
  IkReal x1;
  IkReal x0;
  IkReal *eerot_local;
  IkReal *eetrans_local;
  IkReal *j_local;
  
  dVar1 = IKcos(*j);
  dVar2 = IKcos(j[1]);
  dVar3 = IKsin(j[2]);
  dVar4 = IKcos(j[2]);
  dVar5 = IKsin(j[1]);
  dVar6 = IKsin(j[3]);
  dVar7 = IKcos(j[3]);
  dVar8 = IKsin(*j);
  dVar9 = IKcos(j[5]);
  dVar10 = IKsin(j[5]);
  dVar11 = IKsin(j[4]);
  dVar12 = IKcos(j[4]);
  dVar13 = dVar12 * 1.0;
  dVar14 = dVar1 * 0.40675;
  dVar15 = dVar1 * 1.0;
  dVar16 = dVar11 * 1.0;
  dVar17 = dVar8 * 0.40675;
  dVar18 = dVar8 * 1.0;
  dVar19 = dVar4 * dVar5;
  dVar20 = dVar2 * dVar3;
  dVar4 = dVar2 * dVar4;
  dVar3 = dVar3 * dVar5;
  dVar21 = dVar3 - dVar4 * 1.0;
  dVar22 = dVar20 + dVar19 * 1.0;
  dVar23 = dVar22 * -1.0;
  dVar24 = dVar1 * dVar4 + dVar15 * dVar3 * -1.0;
  dVar25 = dVar4 * dVar8 - dVar18 * dVar3;
  dVar26 = dVar23 * dVar7;
  dVar22 = dVar22 * dVar6;
  dVar27 = dVar15 * (dVar20 * -1.0 - dVar19);
  dVar28 = dVar18 * (dVar20 * -1.0 - dVar19);
  dVar29 = dVar24 * dVar7 + dVar18 * -1.0 * dVar6;
  dVar30 = dVar1 * dVar6 + dVar25 * dVar7;
  dVar31 = dVar6 * (dVar15 * -1.0 * dVar4 + dVar15 * dVar3) + dVar18 * -1.0 * dVar7;
  dVar32 = dVar1 * dVar7 + dVar6 * (dVar18 * -1.0 * dVar4 + dVar18 * dVar3);
  *eerot = dVar31 * dVar10 + dVar9 * (dVar12 * dVar29 + dVar11 * dVar27);
  eerot[1] = dVar31 * dVar9 + dVar10 * (dVar13 * -1.0 * dVar29 + dVar16 * -1.0 * dVar27);
  eerot[2] = dVar11 * dVar29 + dVar12 * dVar15 * (dVar19 + dVar20);
  *eetrans = dVar11 * (dVar7 * 0.40675 * dVar24 + dVar17 * -1.0 * dVar6) +
             dVar1 * 0.3095 * dVar20 +
             dVar1 * 0.3095 * dVar19 +
             dVar1 * dVar5 * 0.29 + dVar12 * (dVar14 * dVar20 + dVar14 * dVar19);
  eerot[3] = dVar9 * (dVar11 * dVar28 + dVar12 * dVar30) + dVar32 * dVar10;
  eerot[4] = dVar32 * dVar9 + dVar10 * (dVar16 * -1.0 * dVar28 + dVar13 * -1.0 * dVar30);
  eerot[5] = dVar11 * dVar30 + dVar12 * dVar18 * (dVar19 + dVar20);
  eetrans[1] = dVar11 * (dVar7 * 0.40675 * dVar25 + dVar14 * dVar6) +
               dVar5 * 0.29 * dVar8 +
               dVar8 * 0.3095 * dVar20 +
               dVar12 * (dVar17 * dVar19 + dVar17 * dVar20) + dVar8 * 0.3095 * dVar19;
  eerot[6] = dVar9 * (dVar11 * dVar21 + dVar12 * dVar26) + dVar22 * dVar10;
  eerot[7] = dVar22 * dVar9 + dVar10 * (dVar13 * -1.0 * dVar26 + dVar16 * -1.0 * dVar21);
  eerot[8] = dVar12 * (dVar4 * 1.0 - dVar3) + dVar11 * dVar7 * dVar23;
  eetrans[2] = dVar4 * 0.3095 +
               dVar12 * (dVar3 * -0.40675 + dVar4 * 0.40675) +
               dVar3 * -0.3095 +
               dVar11 * dVar7 * (dVar20 * -0.40675 + dVar19 * -0.40675) + dVar2 * 0.29 + 0.3625;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47;
x0=IKcos(j[0]);
x1=IKcos(j[1]);
x2=IKsin(j[2]);
x3=IKcos(j[2]);
x4=IKsin(j[1]);
x5=IKsin(j[3]);
x6=IKcos(j[3]);
x7=IKsin(j[0]);
x8=IKcos(j[5]);
x9=IKsin(j[5]);
x10=IKsin(j[4]);
x11=IKcos(j[4]);
x12=((1.0)*x11);
x13=((0.40675)*x0);
x14=((1.0)*x0);
x15=((1.0)*x10);
x16=((0.40675)*x7);
x17=((1.0)*x7);
x18=((0.3095)*x7);
x19=((0.3095)*x0);
x20=((0.40675)*x6);
x21=((0.29)*x4);
x22=(x3*x4);
x23=(x1*x2);
x24=(x1*x3);
x25=(x10*x6);
x26=(x2*x4);
x27=(x5*x7);
x28=((1.0)*x24);
x29=(x14*x26);
x30=(x17*x26);
x31=((((-1.0)*x28))+x26);
x32=((((1.0)*x23))+(((1.0)*x22)));
x33=((-1.0)*x32);
x34=(((x0*x24))+(((-1.0)*x29)));
x35=((((-1.0)*x30))+((x24*x7)));
x36=(x33*x6);
x37=(x32*x5);
x38=(x14*(((((-1.0)*x22))+(((-1.0)*x23)))));
x39=(x14*((x22+x23)));
x40=(x17*(((((-1.0)*x22))+(((-1.0)*x23)))));
x41=(x17*((x22+x23)));
x42=(x35*x6);
x43=(x10*x38);
x44=(((x34*x6))+(((-1.0)*x17*x5)));
x45=(((x0*x5))+x42);
x46=(((x5*(((((-1.0)*x14*x24))+x29))))+(((-1.0)*x17*x6)));
x47=(((x0*x6))+((x5*(((((-1.0)*x17*x24))+x30)))));
eerot[0]=(((x46*x9))+((x8*((((x11*x44))+x43)))));
eerot[1]=(((x46*x8))+((x9*(((((-1.0)*x12*x44))+(((-1.0)*x15*x38)))))));
eerot[2]=(((x10*x44))+((x11*x39)));
eetrans[0]=(((x0*x21))+((x11*((((x13*x23))+((x13*x22))))))+((x19*x22))+((x19*x23))+((x10*((((x20*x34))+(((-1.0)*x16*x5)))))));
eerot[3]=(((x8*((((x10*x40))+((x11*x45))))))+((x47*x9)));
eerot[4]=(((x47*x8))+((x9*(((((-1.0)*x15*x40))+(((-1.0)*x12*x45)))))));
eerot[5]=(((x10*x45))+((x11*x41)));
eetrans[1]=(((x11*((((x16*x22))+((x16*x23))))))+((x18*x22))+((x18*x23))+((x21*x7))+((x10*((((x20*x35))+((x13*x5)))))));
eerot[6]=(((x8*((((x10*x31))+((x11*x36))))))+((x37*x9)));
eerot[7]=(((x37*x8))+((x9*(((((-1.0)*x12*x36))+(((-1.0)*x15*x31)))))));
eerot[8]=(((x11*(((((-1.0)*x26))+x28))))+((x25*x33)));
eetrans[2]=((0.3625)+(((0.29)*x1))+((x25*(((((-0.40675)*x23))+(((-0.40675)*x22))))))+(((-0.3095)*x26))+((x11*(((((-0.40675)*x26))+(((0.40675)*x24))))))+(((0.3095)*x24)));
}